

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_subgraph.hpp
# Opt level: O2

size_t __thiscall Disa::Adjacency_Subgraph::vertex_level(Adjacency_Subgraph *this,size_t *i_vertex)

{
  pointer puVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  source_location *location;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  location = (source_location *)
             (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->graph).offset.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)location;
  if ((lVar2 != 0) &&
     (location = (source_location *)*i_vertex, location < (source_location *)((lVar2 >> 3) - 1U))) {
    puVar1 = (this->level_set_value).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar1 == (this->level_set_value).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      sVar3 = 0;
    }
    else {
      sVar3 = puVar1[(long)location];
    }
    return sVar3;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"\n");
  local_40 = &PTR_s__workspace_llm4binary_github_lic_00157c90;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
  poVar4 = std::operator<<(poVar4,(string *)&local_38);
  std::__cxx11::to_string(&local_e0,*i_vertex);
  std::operator+(&local_c0,"Local vertex index ",&local_e0);
  std::operator+(&local_a0,&local_c0," not in range [0, ");
  std::__cxx11::to_string(&local_100,*i_vertex);
  std::operator+(&local_80,&local_a0,&local_100);
  std::operator+(&local_60,&local_80,").");
  poVar4 = std::operator<<(poVar4,(string *)&local_60);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

[[nodiscard]] inline std::size_t vertex_level(const std::size_t& i_vertex) const {
    ASSERT_DEBUG(i_vertex < size_vertex(), "Local vertex index " + std::to_string(i_vertex) + " not in range [0, " +
                                           std::to_string(i_vertex) + ").");
    return level_set_value.empty() ? 0 : level_set_value[i_vertex];
  }